

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

void check_pseudo_is_top(Proc *proc,Pseudo *pseudo)

{
  uint uVar1;
  PseudoGenerator *pPStack_20;
  int top;
  PseudoGenerator *gen;
  Pseudo *pseudo_local;
  Proc *proc_local;
  
  if ((*(uint *)pseudo >> 0x14 & 1) != 0) {
    __assert_fail("!pseudo->freed",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                  ,0xc5,"void check_pseudo_is_top(Proc *, Pseudo *)");
  }
  switch(*(uint *)pseudo & 0xf) {
  case 1:
    pPStack_20 = &proc->temp_flt_pseudos;
    break;
  case 2:
  case 3:
    pPStack_20 = &proc->temp_int_pseudos;
    break;
  case 4:
  case 0xb:
    pPStack_20 = &proc->temp_pseudos;
    break;
  default:
    return;
  }
  if ((((pseudo->field_3).symbol == (LuaSymbol *)0x0) &&
      (uVar1 = top_reg(pPStack_20), -1 < (int)uVar1)) && (uVar1 != (*(uint *)pseudo >> 4 & 0xffff)))
  {
    fprintf(_stderr,"Top expected %u, found %u\n",(ulong)uVar1,
            (ulong)(*(uint *)pseudo >> 4 & 0xffff));
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                  ,0xdd,"void check_pseudo_is_top(Proc *, Pseudo *)");
  }
  return;
}

Assistant:

static void check_pseudo_is_top(Proc *proc, Pseudo *pseudo) {
	PseudoGenerator *gen;
	assert(!pseudo->freed);
	switch (pseudo->type) {
	case PSEUDO_TEMP_FLT:
		gen = &proc->temp_flt_pseudos;
		break;
	case PSEUDO_TEMP_INT:
	case PSEUDO_TEMP_BOOL:
		gen = &proc->temp_int_pseudos;
		break;
	case PSEUDO_RANGE:
	case PSEUDO_TEMP_ANY:
		gen = &proc->temp_pseudos;
		break;
	default:
		// Not a temp, so no need to do anything
		return;
	}
	if (pseudo->temp_for_local)
		return;
	int top = top_reg(gen);
	if (top < 0)
		return;
	if (top != pseudo->regnum) {
		fprintf(stderr, "Top expected %u, found %u\n", top, pseudo->regnum);
		assert(false);
	}
}